

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void arrayminmax(double *x,int N,double *amin,double *amax)

{
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  
  *amax = -1.79769313486232e+308;
  *amin = 1.79769313486232e+308;
  uVar1 = 0;
  uVar2 = (ulong)(uint)N;
  if (N < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    dVar3 = x[uVar1];
    if (x[uVar1] <= *amax) {
      dVar3 = *amax;
    }
    *amax = dVar3;
    dVar3 = x[uVar1];
    if (*amin <= x[uVar1]) {
      dVar3 = *amin;
    }
    *amin = dVar3;
  }
  return;
}

Assistant:

void arrayminmax(double *x, int N, double *amin,double *amax) {
	int i;
	*amax = - DBL_MAX;
	*amin = DBL_MAX;

	for(i = 0; i < N;++i) {
		*amax = x[i] > *amax ? x[i] : *amax;
		*amin = x[i] < *amin ? x[i] : *amin;
	}

}